

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse.cpp
# Opt level: O1

void __thiscall test_matrix_sparse_erase_Test::TestBody(test_matrix_sparse_erase_Test *this)

{
  initializer_list<double> value;
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  Scalar *pSVar6;
  StringLike<const_char_*> *regex;
  StringLike<const_char_*> *regex_00;
  StringLike<const_char_*> *regex_01;
  char *pcVar7;
  char *pcVar8;
  pointer *__ptr;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  initializer_list<unsigned_long> non_zero;
  initializer_list<unsigned_long> index;
  DeathTest *gtest_dt;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  Matrix_Sparse matrix;
  iterator_element iter;
  undefined1 local_168 [16];
  undefined1 local_158 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  undefined1 local_138 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_130;
  pointer local_128;
  AssertHelper local_110;
  pointer local_108;
  Matrix_Sparse local_100;
  iterator local_b0;
  undefined8 uStack_a8;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_a0;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_88;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_70;
  undefined1 local_58 [8];
  undefined8 uStack_50;
  undefined8 local_48;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  char cStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  char cStack_39;
  
  local_58 = (undefined1  [8])0x0;
  uStack_50 = (double *)0x2;
  local_48 = 3;
  local_158 = (undefined1  [8])0x1;
  _Stack_150._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_148._M_allocated_capacity = 0;
  local_b0 = (iterator)local_138;
  local_138 = (undefined1  [8])0x3ff0000000000000;
  pbStack_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                0x4000000000000000;
  local_128 = (pointer)&DAT_4008000000000000;
  uStack_a8 = 3;
  pcVar8 = (char *)0x2;
  value._M_len = 3;
  value._M_array = local_b0;
  non_zero._M_len = 3;
  non_zero._M_array = (iterator)local_58;
  index._M_len = 3;
  index._M_array = (iterator)local_158;
  Disa::Matrix_Sparse::Matrix_Sparse(&local_100,non_zero,index,value,2);
  local_138 = (undefined1  [8])0x0;
  local_168._0_8_ = (AssertHelperData *)0x1;
  Disa::Matrix_Sparse::find
            ((iterator_element *)local_158,&local_100,(size_t *)local_138,(size_t *)local_168);
  Disa::Matrix_Sparse::erase
            ((iterator_element *)local_58,&local_100,
             (Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)local_158);
  local_138 = (undefined1  [8])
              (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               )0x0;
  if (local_100.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_100.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_138 = (undefined1  [8])
                (((long)local_100.row_non_zero.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_100.row_non_zero.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) + -1);
  }
  local_168._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_158,"matrix.size_row()","2",(unsigned_long *)local_138,
             (int *)local_168);
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_138);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_150._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(_Stack_150._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x14b,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_168,(Message *)local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_168);
    if (local_138 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_138 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_150._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_150,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_150._M_pi);
  }
  local_138 = (undefined1  [8])local_100.column_size;
  local_168._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_158,"matrix.size_column()","2",(unsigned_long *)local_138,
             (int *)local_168);
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_138);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_150._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(_Stack_150._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x14c,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_168,(Message *)local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_168);
    if (local_138 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_138 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_150._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_150,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_150._M_pi);
  }
  local_138 = (undefined1  [8])
              ((long)local_100.column_index.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_100.column_index.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3);
  local_168._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_158,"matrix.size_non_zero()","2",(unsigned_long *)local_138,
             (int *)local_168);
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_138);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_150._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(_Stack_150._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x14d,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_168,(Message *)local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_168);
    if (local_138 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_138 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_150._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_150,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_150._M_pi);
  }
  local_110.data_ = (AssertHelperData *)0x0;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_168,(size_t *)&local_100);
  Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::end
            ((iterator *)local_158,(Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_168);
  auVar11[0] = -(local_148._M_local_buf[0] == (char)local_48);
  auVar11[1] = -(local_148._M_local_buf[1] == local_48._1_1_);
  auVar11[2] = -(local_148._M_local_buf[2] == local_48._2_1_);
  auVar11[3] = -(local_148._M_local_buf[3] == local_48._3_1_);
  auVar11[4] = -(local_148._M_local_buf[4] == local_48._4_1_);
  auVar11[5] = -(local_148._M_local_buf[5] == local_48._5_1_);
  auVar11[6] = -(local_148._M_local_buf[6] == local_48._6_1_);
  auVar11[7] = -(local_148._M_local_buf[7] == local_48._7_1_);
  auVar11[8] = -(local_148._M_local_buf[8] == cStack_40);
  auVar11[9] = -(local_148._M_local_buf[9] == cStack_3f);
  auVar11[10] = -(local_148._M_local_buf[10] == cStack_3e);
  auVar11[0xb] = -(local_148._M_local_buf[0xb] == cStack_3d);
  auVar11[0xc] = -(local_148._M_local_buf[0xc] == cStack_3c);
  auVar11[0xd] = -(local_148._M_local_buf[0xd] == cStack_3b);
  auVar11[0xe] = -(local_148._M_local_buf[0xe] == cStack_3a);
  auVar11[0xf] = -(local_148._M_local_buf[0xf] == cStack_39);
  auVar10[0] = -(local_158[0] == local_58[0]);
  auVar10[1] = -(local_158[1] == local_58[1]);
  auVar10[2] = -(local_158[2] == local_58[2]);
  auVar10[3] = -(local_158[3] == local_58[3]);
  auVar10[4] = -(local_158[4] == local_58[4]);
  auVar10[5] = -(local_158[5] == local_58[5]);
  auVar10[6] = -(local_158[6] == local_58[6]);
  auVar10[7] = -(local_158[7] == local_58[7]);
  auVar10[8] = -(_Stack_150._M_pi._0_1_ == uStack_50._0_1_);
  auVar10[9] = -(_Stack_150._M_pi._1_1_ == uStack_50._1_1_);
  auVar10[10] = -(_Stack_150._M_pi._2_1_ == uStack_50._2_1_);
  auVar10[0xb] = -(_Stack_150._M_pi._3_1_ == uStack_50._3_1_);
  auVar10[0xc] = -(_Stack_150._M_pi._4_1_ == uStack_50._4_1_);
  auVar10[0xd] = -(_Stack_150._M_pi._5_1_ == uStack_50._5_1_);
  auVar10[0xe] = -(_Stack_150._M_pi._6_1_ == uStack_50._6_1_);
  auVar10[0xf] = -(_Stack_150._M_pi._7_1_ == uStack_50._7_1_);
  auVar10 = auVar10 & auVar11;
  bVar9 = (ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) == 0xffff;
  local_138[0] = bVar9;
  pbStack_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar9) {
    testing::Message::Message((Message *)local_168);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_138,
               (AssertionResult *)"iter == matrix[0].end()","false","true",pcVar8);
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x14e,(char *)local_158);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if (local_158 != (undefined1  [8])&local_148) {
      operator_delete((void *)local_158,local_148._M_allocated_capacity + 1);
    }
    if ((AssertHelperData *)local_168._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_168._0_8_ + 8))();
    }
  }
  if (pbStack_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_130,pbStack_130);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_158,"*iter","3.0",*uStack_50,3.0);
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_138);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_150._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((_Alloc_hider *)&(_Stack_150._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x14f,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_168,(Message *)local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_168);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_138 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_138 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_150._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_150,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_150._M_pi);
  }
  local_168._0_8_ = (AssertHelperData *)0x0;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_138,(size_t *)&local_100);
  local_110.data_ = (AssertHelperData *)0x0;
  pSVar6 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_138,(size_t *)&local_110);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_158,"matrix[0][0]","2.0",*pSVar6,2.0);
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_138);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_150._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((_Alloc_hider *)&(_Stack_150._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x150,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_168,(Message *)local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_168);
    if (local_138 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_138 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_150._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_150,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_150._M_pi);
  }
  local_168._0_8_ = (AssertHelperData *)0x1;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_138,(size_t *)&local_100);
  local_110.data_ = (AssertHelperData *)0x0;
  pSVar6 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_138,(size_t *)&local_110);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_158,"matrix[1][0]","3.0",*pSVar6,3.0);
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_138);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_150._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((_Alloc_hider *)&(_Stack_150._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x151,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_168,(Message *)local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_168);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_138 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_138 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_150._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_150,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_150._M_pi);
  }
  bVar9 = testing::internal::AlwaysTrue();
  if (bVar9) {
    local_138 = (undefined1  [8])0x169570;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_158,
               (testing *)local_138,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_70,(PolymorphicMatcher *)local_158);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_150._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_150._M_pi);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("matrix.erase(matrix.find(3, 0))",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_70,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x154,(DeathTest **)local_168);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_70);
    uVar1 = local_168._0_8_;
    bVar9 = true;
    if (bVar3) {
      if ((AssertHelperData *)local_168._0_8_ != (AssertHelperData *)0x0) {
        iVar5 = (**(code **)(*(long *)local_168._0_8_ + 0x10))(local_168._0_8_);
        uVar2 = local_168._0_8_;
        if (iVar5 == 0) {
          iVar5 = (**(code **)(*(long *)local_168._0_8_ + 0x18))(local_168._0_8_);
          bVar9 = testing::internal::ExitedUnsuccessfully(iVar5);
          cVar4 = (**(code **)(*(long *)uVar2 + 0x20))(uVar2,bVar9);
          if (cVar4 != '\0') goto LAB_0011a5a8;
          bVar9 = true;
          bVar3 = false;
        }
        else {
          if (iVar5 == 1) {
            bVar9 = testing::internal::AlwaysTrue();
            if (bVar9) {
              local_110.data_ = (AssertHelperData *)0x3;
              local_108 = (pointer)0x0;
              Disa::Matrix_Sparse::find
                        ((iterator_element *)local_158,&local_100,(size_t *)&local_110,
                         (size_t *)&local_108);
              Disa::Matrix_Sparse::erase
                        ((iterator_element *)local_138,&local_100,
                         (Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)local_158);
            }
            (**(code **)(*(long *)local_168._0_8_ + 0x28))(local_168._0_8_,2);
            (**(code **)(*(long *)uVar2 + 0x28))(uVar2,0);
          }
LAB_0011a5a8:
          bVar9 = false;
          bVar3 = true;
        }
        (**(code **)(*(long *)uVar1 + 8))(uVar1);
        if (!bVar3) goto LAB_0011a5bb;
      }
      bVar9 = false;
    }
LAB_0011a5bb:
    if (bVar9) goto LAB_0011a5bf;
  }
  else {
LAB_0011a5bf:
    testing::Message::Message((Message *)local_158);
    pcVar8 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x154,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
    if (local_158 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_158 + 8))();
    }
  }
  bVar9 = testing::internal::AlwaysTrue();
  if (bVar9) {
    local_138 = (undefined1  [8])0x169570;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_158,
               (testing *)local_138,regex_00);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_88,(PolymorphicMatcher *)local_158);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_150._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_150._M_pi);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("matrix.erase(matrix.find(0, 2))",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_88,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x155,(DeathTest **)local_168);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_88);
    uVar1 = local_168._0_8_;
    bVar9 = true;
    if (bVar3) {
      if ((AssertHelperData *)local_168._0_8_ != (AssertHelperData *)0x0) {
        iVar5 = (**(code **)(*(long *)local_168._0_8_ + 0x10))(local_168._0_8_);
        uVar2 = local_168._0_8_;
        if (iVar5 == 0) {
          iVar5 = (**(code **)(*(long *)local_168._0_8_ + 0x18))(local_168._0_8_);
          bVar9 = testing::internal::ExitedUnsuccessfully(iVar5);
          cVar4 = (**(code **)(*(long *)uVar2 + 0x20))(uVar2,bVar9);
          if (cVar4 != '\0') goto LAB_0011a750;
          bVar9 = true;
          bVar3 = false;
        }
        else {
          if (iVar5 == 1) {
            bVar9 = testing::internal::AlwaysTrue();
            if (bVar9) {
              local_110.data_ = (AssertHelperData *)0x0;
              local_108 = (pointer)0x2;
              Disa::Matrix_Sparse::find
                        ((iterator_element *)local_158,&local_100,(size_t *)&local_110,
                         (size_t *)&local_108);
              Disa::Matrix_Sparse::erase
                        ((iterator_element *)local_138,&local_100,
                         (Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)local_158);
            }
            (**(code **)(*(long *)local_168._0_8_ + 0x28))(local_168._0_8_,2);
            (**(code **)(*(long *)uVar2 + 0x28))(uVar2,0);
          }
LAB_0011a750:
          bVar9 = false;
          bVar3 = true;
        }
        (**(code **)(*(long *)uVar1 + 8))(uVar1);
        if (!bVar3) goto LAB_0011a763;
      }
      bVar9 = false;
    }
LAB_0011a763:
    if (bVar9) goto LAB_0011a767;
  }
  else {
LAB_0011a767:
    testing::Message::Message((Message *)local_158);
    pcVar8 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x155,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
    if (local_158 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_158 + 8))();
    }
  }
  bVar9 = testing::internal::AlwaysTrue();
  if (bVar9) {
    local_138 = (undefined1  [8])0x169570;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_158,
               (testing *)local_138,regex_01);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_a0,(PolymorphicMatcher *)local_158);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_150._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_150._M_pi);
    }
    bVar9 = testing::internal::DeathTest::Create
                      ("matrix.erase(matrix.find(1, 1))",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_a0,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x156,(DeathTest **)local_168);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_a0);
    uVar1 = local_168._0_8_;
    iVar5 = 6;
    if (bVar9) {
      if ((AssertHelperData *)local_168._0_8_ != (AssertHelperData *)0x0) {
        iVar5 = (**(code **)(*(long *)local_168._0_8_ + 0x10))(local_168._0_8_);
        uVar2 = local_168._0_8_;
        if (iVar5 == 0) {
          iVar5 = (**(code **)(*(long *)local_168._0_8_ + 0x18))(local_168._0_8_);
          bVar9 = testing::internal::ExitedUnsuccessfully(iVar5);
          cVar4 = (**(code **)(*(long *)uVar2 + 0x20))(uVar2,bVar9);
          if (cVar4 != '\0') goto LAB_0011a8f5;
          iVar5 = 6;
          bVar9 = false;
        }
        else {
          if (iVar5 == 1) {
            bVar9 = testing::internal::AlwaysTrue();
            if (bVar9) {
              local_110.data_ = (AssertHelperData *)0x1;
              local_108 = (pointer)0x1;
              Disa::Matrix_Sparse::find
                        ((iterator_element *)local_158,&local_100,(size_t *)&local_110,
                         (size_t *)&local_108);
              Disa::Matrix_Sparse::erase
                        ((iterator_element *)local_138,&local_100,
                         (Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)local_158);
            }
            (**(code **)(*(long *)local_168._0_8_ + 0x28))(local_168._0_8_,2);
            (**(code **)(*(long *)uVar2 + 0x28))(uVar2,0);
          }
LAB_0011a8f5:
          iVar5 = 0;
          bVar9 = true;
        }
        (**(code **)(*(long *)uVar1 + 8))(uVar1);
        if (!bVar9) goto LAB_0011a908;
      }
      iVar5 = 0;
    }
LAB_0011a908:
    if (iVar5 == 0) goto LAB_0011a962;
  }
  testing::Message::Message((Message *)local_158);
  pcVar8 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_138,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
             ,0x156,pcVar8);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)local_158);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
  if (local_158 != (undefined1  [8])0x0) {
    (**(code **)(*(size_type *)local_158 + 8))();
  }
LAB_0011a962:
  Disa::Matrix_Sparse::~Matrix_Sparse(&local_100);
  return;
}

Assistant:

TEST(test_matrix_sparse, erase) {
  Matrix_Sparse matrix({0, 2, 3}, {1, 0, 0}, {1.0, 2.0, 3.0}, 2);
  auto iter = matrix.erase(matrix.find(0, 1));
  EXPECT_EQ(matrix.size_row(), 2);
  EXPECT_EQ(matrix.size_column(), 2);
  EXPECT_EQ(matrix.size_non_zero(), 2);
  EXPECT_TRUE(iter == matrix[0].end());  // should point to end
  EXPECT_DOUBLE_EQ(*iter, 3.0);          // end should be the next row over.
  EXPECT_DOUBLE_EQ(matrix[0][0], 2.0);
  EXPECT_DOUBLE_EQ(matrix[1][0], 3.0);

  // Check debug undefined behaviour
  EXPECT_DEATH(matrix.erase(matrix.find(3, 0)), "./*");
  EXPECT_DEATH(matrix.erase(matrix.find(0, 2)), "./*");
  EXPECT_DEATH(matrix.erase(matrix.find(1, 1)), "./*");
}